

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O1

void __thiscall FileTest_Write_Test::TestBody(FileTest_Write_Test *this)

{
  bool bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  size_t num_chars_left;
  void *__buf;
  int __fd;
  char *ptr;
  char *pcVar3;
  file write_end;
  file read_end;
  AssertionResult gtest_ar;
  file local_58;
  file local_54;
  AssertHelper local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_54.fd_ = -1;
  local_58.fd_ = -1;
  fmt::v5::file::pipe(&local_54,&local_58.fd_);
  __buf = (void *)0x4;
  pcVar3 = "test";
  do {
    __fd = (int)pcVar3;
    sVar2 = fmt::v5::file::write(&local_58,__fd,__buf,in_RCX);
    pcVar3 = pcVar3 + sVar2;
    __buf = (void *)((long)__buf - sVar2);
  } while (__buf != (void *)0x0);
  fmt::v5::file::close(&local_58,__fd);
  read_abi_cxx11_((int)&local_48,&local_54,4);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_28,"\"test\"","read(read_end, std::strlen(\"test\"))",(char (*) [5])0x1602de,
             &local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x125,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      }
      local_48._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::v5::file::~file(&local_58);
  fmt::v5::file::~file(&local_54);
  return;
}

Assistant:

TEST(FileTest, Write) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  write(write_end, "test");
  write_end.close();
  EXPECT_READ(read_end, "test");
}